

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O2

int main(void)

{
  Color value;
  ostream *poVar1;
  enable_if_t<Color,_optional<std::decay_t<Color>_>,_std::equal_to<void>_> eVar2;
  enable_if_t<Color,_optional<std::decay_t<Color>_>,_magic_enum::detail::case_insensitive<>_>
  value_00;
  enable_if_t<Color,_optional<std::decay_t<Color>_>_> value_01;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  long lVar4;
  enable_if_t<Color,_string_view> eVar5;
  
  eVar5 = magic_enum::enum_name<Color,(magic_enum::detail::enum_subtype)0>(RED);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,eVar5._M_str,eVar5._M_len);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"Color names:");
  for (lVar4 = 8; lVar4 != 0x38; lVar4 = lVar4 + 0x10) {
    poVar1 = std::operator<<((ostream *)&std::cout," ");
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,*(char **)((long)&DAT_00103cd0 + lVar4),
               *(long *)((long)&__do_global_dtors_aux_fini_array_entry + lVar4));
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  eVar2 = magic_enum::enum_cast<Color,(magic_enum::detail::enum_subtype)0,std::equal_to<void>>
                    (4,"BLUE");
  if (((ulong)eVar2.super__Optional_base<Color,_true,_true>._M_payload.
              super__Optional_payload_base<Color> >> 0x20 & 1) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"BLUE = ");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,eVar2.super__Optional_base<Color,_true,_true>._M_payload.
                               super__Optional_payload_base<Color>._M_payload);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  value_00 = magic_enum::
             enum_cast<Color,(magic_enum::detail::enum_subtype)0,magic_enum::detail::case_insensitive<std::equal_to<void>>>
                       (4,"blue");
  if (((ulong)value_00.super__Optional_base<Color,_true,_true>._M_payload.
              super__Optional_payload_base<Color> & 0x100000000) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"BLUE = ");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,value_00.super__Optional_base<Color,_true,_true>._M_payload.
                               super__Optional_payload_base<Color>._M_payload);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  value_01 = magic_enum::enum_cast<Color,(magic_enum::detail::enum_subtype)0>(10);
  if (((ulong)value_01.super__Optional_base<Color,_true,_true>._M_payload.
              super__Optional_payload_base<Color> & 0x100000000) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"GREEN = ");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,value_01.super__Optional_base<Color,_true,_true>._M_payload.
                               super__Optional_payload_base<Color>._M_payload);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"RED = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,-10);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Color: ");
  pbVar3 = magic_enum::ostream_operators::operator<<<char,_std::char_traits<char>,_Color,_0>
                     ((basic_ostream<char,_std::char_traits<char>_> *)poVar1,RED);
  poVar1 = std::operator<<((ostream *)pbVar3," ");
  pbVar3 = magic_enum::ostream_operators::operator<<<char,_std::char_traits<char>,_Color,_0>
                     ((basic_ostream<char,_std::char_traits<char>_> *)poVar1,
                      (optional<Color>)
                      value_00.super__Optional_base<Color,_true,_true>._M_payload.
                      super__Optional_payload_base<Color>);
  poVar1 = std::operator<<((ostream *)pbVar3," ");
  pbVar3 = magic_enum::ostream_operators::operator<<<char,_std::char_traits<char>,_Color,_0>
                     ((basic_ostream<char,_std::char_traits<char>_> *)poVar1,
                      (optional<Color>)
                      value_01.super__Optional_base<Color,_true,_true>._M_payload.
                      super__Optional_payload_base<Color>);
  std::endl<char,std::char_traits<char>>((ostream *)pbVar3);
  poVar1 = std::operator<<((ostream *)&std::cout,"Color enum size: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Color[0] = ");
  pbVar3 = magic_enum::ostream_operators::operator<<<char,_std::char_traits<char>,_Color,_0>
                     ((basic_ostream<char,_std::char_traits<char>_> *)poVar1,RED);
  std::endl<char,std::char_traits<char>>((ostream *)pbVar3);
  std::operator<<((ostream *)&std::cout,"Colors values:");
  for (lVar4 = 0; lVar4 != 0xc; lVar4 = lVar4 + 4) {
    value = *(Color *)((long)&DAT_00102198 + lVar4);
    poVar1 = std::operator<<((ostream *)&std::cout," ");
    magic_enum::ostream_operators::operator<<<char,_std::char_traits<char>,_Color,_0>
              ((basic_ostream<char,_std::char_traits<char>_> *)poVar1,value);
  }
  poVar1 = (ostream *)&std::cout;
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  lVar4 = 0;
  do {
    if (lVar4 == 0x10) {
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,5);
LAB_0010149c:
      std::endl<char,std::char_traits<char>>(poVar1);
      std::operator<<((ostream *)&std::cout,"Colors entries:");
      for (lVar4 = 0x10; lVar4 != 0x58; lVar4 = lVar4 + 0x18) {
        poVar1 = std::operator<<((ostream *)&std::cout," ");
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar1,*(char **)((long)&DAT_00103d00 + lVar4),
                            *(long *)(&UNK_00103cf8 + lVar4));
        poVar1 = std::operator<<(poVar1," = ");
        std::ostream::operator<<(poVar1,*(int *)(&UNK_00103cf0 + lVar4));
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      return 0;
    }
    if (*(int *)((long)&magic_enum::detail::
                        values_v<main::Flags,(magic_enum::detail::enum_subtype)0> + lVar4) == 5) {
      for (lVar4 = 0; lVar4 != 1; lVar4 = lVar4 + 1) {
        std::ostream::put('X');
      }
      goto LAB_0010149c;
    }
    lVar4 = lVar4 + 4;
  } while( true );
}

Assistant:

int main() {
  // Enum variable to string name.
  Color c1 = Color::RED;
  auto c1_name = magic_enum::enum_name(c1);
  std::cout << c1_name << std::endl; // RED

  // String enum name sequence.
  constexpr auto names = magic_enum::enum_names<Color>();
  std::cout << "Color names:";
  for (const auto& n : names) {
    std::cout << " " << n;
  }
  std::cout << std::endl;
  // Color names: RED BLUE GREEN

  // String name to enum value.
  auto c2 = magic_enum::enum_cast<Color>("BLUE");
  if (c2.has_value()) {
    std::cout << "BLUE = " << to_integer(c2.value()) << std::endl; // BLUE = 0
  }

  // Case insensitive enum_cast.
  c2 = magic_enum::enum_cast<Color>("blue", magic_enum::case_insensitive);
  if (c2.has_value()) {
    std::cout << "BLUE = " << to_integer(c2.value()) << std::endl; // BLUE = 0
  }

  // Integer value to enum value.
  auto c3 = magic_enum::enum_cast<Color>(10);
  if (c3.has_value()) {
    std::cout << "GREEN = " << magic_enum::enum_integer(c3.value()) << std::endl; // GREEN = 10
  }

  // Enum value to integer value.
  auto c4_integer = magic_enum::enum_integer(Color::RED);
  std::cout << "RED = " << c4_integer << std::endl; // RED = -10

  using magic_enum::iostream_operators::operator<<; // out-of-the-box ostream operator for all enums.
  // Ostream operator for enum.
  std::cout << "Color: " << c1 << " " << c2 << " " << c3 << std::endl; // Color: RED BLUE GREEN

  // Number of enum values.
  std::cout << "Color enum size: " << magic_enum::enum_count<Color>() << std::endl; // Color size: 3

  // Indexed access to enum value.
  std::cout << "Color[0] = " << magic_enum::enum_value<Color>(0) << std::endl; // Color[0] = RED

  // Enum value sequence.
  constexpr auto values = magic_enum::enum_values<Color>();
  std::cout << "Colors values:";
  for (const auto c : values) {
    std::cout << " " << c; // Ostream operator for enum.
  }
  std::cout << std::endl;
  // Color values: RED BLUE GREEN

  enum class Flags { A = 1, B = 2, C = 4, D = 8 };
  using namespace magic_enum::bitwise_operators; // out-of-the-box bitwise operators for all enums.
  // Support operators: ~, |, &, ^, |=, &=, ^=.
  Flags flag = Flags::A | Flags::C;
  std::cout << flag << std::endl; // 5

  enum color { red, green, blue };

  // Checks whether type is an Unscoped enumeration.
  static_assert(magic_enum::is_unscoped_enum_v<color>);
  static_assert(!magic_enum::is_unscoped_enum_v<Color>);
  static_assert(!magic_enum::is_unscoped_enum_v<Flags>);

  // Checks whether type is an Scoped enumeration.
  static_assert(!magic_enum::is_scoped_enum_v<color>);
  static_assert(magic_enum::is_scoped_enum_v<Color>);
  static_assert(magic_enum::is_scoped_enum_v<Flags>);

  // Enum pair (value enum, string enum name) sequence.
  constexpr auto entries = magic_enum::enum_entries<Color>();
  std::cout << "Colors entries:";
  for (const auto& e : entries) {
    std::cout << " "  << e.second << " = " << static_cast<int>(e.first);
  }
  std::cout << std::endl;
  // Color entries: RED = -10 BLUE = 0 GREEN = 10

  return 0;
}